

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmersenne.h
# Opt level: O0

void __thiscall CVmMT19937::seed(CVmMT19937 *this,uint32_t s)

{
  uint32_t in_ESI;
  CVmMT19937 *in_RDI;
  int i;
  undefined4 local_10;
  
  base_seed(in_RDI,in_ESI);
  for (local_10 = 0; local_10 < 0x25; local_10 = local_10 + 1) {
    rand(in_RDI);
  }
  return;
}

Assistant:

void seed(uint32_t s)
    {
        /* do a pass through the mt array with LCG values from the seed */
        base_seed(s);

        /* 
         *   discard a few initial values to prime the pump - the MT
         *   algorithm is considered slow at getting started (i.e., it needs
         *   to run through a few iterations before it starts generating good
         *   numbers)
         */
        for (int i = 0 ; i < 37 ; ++i)
            rand();
    }